

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O1

QString * QLocalTime::localTimeAbbbreviationAt
                    (QString *__return_storage_ptr__,qint64 local,TransitionOptions resolve)

{
  char *pcVar1;
  storage_type *psVar2;
  ulong local_69;
  QString *this;
  long in_FS_OFFSET;
  QByteArrayView ba;
  MkTimeResult use;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  char *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_18;
  
  psVar2 = (storage_type *)
           (ulong)(uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                        super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  if (local < 0) {
    local_69 = (local + 1) / 1000 - 1;
  }
  else {
    local_69 = (ulong)local / 1000;
  }
  anon_unknown.dwarf_e337ba::resolveLocalTime((MkTimeResult *)&local_68,local_69,resolve);
  if (local_28._0_1_ == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_003567b4;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (local_38 == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_003567b4;
    qTzName(__return_storage_ptr__,(uint)(0 < (int)local_48));
  }
  else {
    this = (QString *)0xffffffffffffffff;
    do {
      pcVar1 = local_38 + 1 + (long)this;
      this = (QString *)((long)&(this->d).d + 1);
    } while (*pcVar1 != '\0');
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_003567b4:
      __stack_chk_fail();
    }
    ba.m_data = psVar2;
    ba.m_size = (qsizetype)local_38;
    QString::fromLocal8Bit(__return_storage_ptr__,this,ba);
  }
  return __return_storage_ptr__;
}

Assistant:

QString localTimeAbbbreviationAt(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    auto use = resolveLocalTime(QRoundingDown::qDiv<MSECS_PER_SEC>(local), resolve);
    if (!use.good)
        return {};
#ifdef HAVE_TM_ZONE
    if (use.local.tm_zone)
        return QString::fromLocal8Bit(use.local.tm_zone);
#endif
    return qTzName(use.local.tm_isdst > 0 ? 1 : 0);
}